

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::DOMCharacterDataImpl::substringData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLSize_t offset,XMLSize_t count)

{
  short *psVar1;
  short *psVar2;
  ulong uVar3;
  XMLCh *pXVar4;
  int iVar5;
  undefined4 extraout_var;
  XMLCh *target;
  ulong uVar6;
  long lVar7;
  undefined8 *puVar8;
  DOMException *this_00;
  MemoryManager **ppMVar9;
  long *plVar10;
  XMLCh *pXVar11;
  XMLCh XVar12;
  long lVar13;
  undefined8 *puVar14;
  XMLCh temp [4096];
  XMLCh aXStack_2038 [4100];
  
  target = aXStack_2038;
  uVar3 = this->fDataBuf->fIndex;
  if (uVar3 < offset) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDoc == (DOMDocumentImpl *)0x0) {
      ppMVar9 = (MemoryManager **)&XMLPlatformUtils::fgMemoryManager;
    }
    else {
      ppMVar9 = &this->fDoc->fMemoryManager;
    }
    DOMException::DOMException(this_00,1,0,*ppMVar9);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar5 = (*node->_vptr_DOMNode[0xc])(node);
  plVar10 = (long *)(CONCAT44(extraout_var,iVar5) + -8);
  if (CONCAT44(extraout_var,iVar5) == 0) {
    plVar10 = (long *)0x0;
  }
  if (0xffe < uVar3) {
    target = (XMLCh *)(**(code **)(*(long *)plVar10[0x2c] + 0x18))
                                ((long *)plVar10[0x2c],uVar3 * 2 + 2);
  }
  pXVar4 = this->fDataBuf->fBuffer;
  pXVar11 = (XMLCh *)0x0;
  pXVar4[this->fDataBuf->fIndex] = L'\0';
  XMLString::copyNString(target,pXVar4 + offset,count);
  target[count] = L'\0';
  if (target != (XMLCh *)0x0) {
    lVar13 = 0;
    do {
      psVar1 = (short *)((long)target + lVar13);
      lVar13 = lVar13 + 2;
    } while (*psVar1 != 0);
    uVar6 = (ulong)(ushort)*target;
    if (uVar6 == 0) {
      uVar6 = 0;
    }
    else {
      XVar12 = target[1];
      if (XVar12 != L'\0') {
        pXVar11 = target + 2;
        do {
          uVar6 = (ulong)(ushort)XVar12 + (uVar6 >> 0x18) + uVar6 * 0x26;
          XVar12 = *pXVar11;
          pXVar11 = pXVar11 + 1;
        } while (XVar12 != L'\0');
      }
      uVar6 = uVar6 % (ulong)plVar10[0x28];
    }
    lVar13 = (lVar13 >> 1) + -1;
    puVar8 = *(undefined8 **)(plVar10[0x27] + uVar6 * 8);
    if (puVar8 == (undefined8 *)0x0) {
      puVar14 = (undefined8 *)(plVar10[0x27] + uVar6 * 8);
    }
    else {
      do {
        puVar14 = puVar8;
        if (puVar14[1] == lVar13) {
          pXVar11 = (XMLCh *)(puVar14 + 2);
          if (pXVar11 == target) goto LAB_002674f4;
          lVar7 = 0;
          do {
            psVar1 = (short *)((long)pXVar11 + lVar7);
            if (*psVar1 == 0) {
              if (*(short *)((long)target + lVar7) == 0) goto LAB_002674f4;
              break;
            }
            psVar2 = (short *)((long)target + lVar7);
            lVar7 = lVar7 + 2;
          } while (*psVar1 == *psVar2);
        }
        puVar8 = (undefined8 *)*puVar14;
      } while ((undefined8 *)*puVar14 != (undefined8 *)0x0);
    }
    puVar8 = (undefined8 *)(**(code **)(*plVar10 + 0x20))(plVar10,lVar13 * 2 + 0x18);
    *puVar14 = puVar8;
    puVar8[1] = lVar13;
    *puVar8 = 0;
    pXVar11 = (XMLCh *)(puVar8 + 2);
    XMLString::copyString(pXVar11,target);
  }
LAB_002674f4:
  if (0xffe < uVar3) {
    (**(code **)(*(long *)plVar10[0x2c] + 0x20))((long *)plVar10[0x2c],target);
  }
  return pXVar11;
}

Assistant:

const XMLCh * DOMCharacterDataImpl::substringData(const DOMNode *node, XMLSize_t offset,
                                           XMLSize_t count) const
{

    // Note: the C++ XMLCh * operation throws the correct DOMExceptions
    //       when parameter values are bad.
    //


    XMLSize_t len = fDataBuf->getLen();

    if (offset > len)
        throw DOMException(DOMException::INDEX_SIZE_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    DOMDocumentImpl *doc = (DOMDocumentImpl *)node->getOwnerDocument();

    XMLCh* newString;
    XMLCh temp[4096];
    if (len >= 4095)
      newString = (XMLCh*) doc->getMemoryManager()->allocate
        (
            (len + 1) * sizeof(XMLCh)
        );//new XMLCh[len+1];
    else
        newString = temp;

    XMLString::copyNString(newString, fDataBuf->getRawBuffer()+offset, count);
    newString[count] = chNull;

    const XMLCh* retString = doc->getPooledString(newString);

    if (len >= 4095)
      doc->getMemoryManager()->deallocate(newString);//delete[] newString;

    return retString;

}